

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_15::LCSSARewriter::UseRewriter::UpdateManagers(UseRewriter *this)

{
  bool bVar1;
  DefUseManager *this_00;
  reference ppIVar2;
  Instruction *insn_1;
  iterator __end3_1;
  iterator __begin3_1;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *__range3_1;
  Instruction *insn;
  iterator __end3;
  iterator __begin3;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *__range3;
  DefUseManager *def_use_mgr;
  UseRewriter *this_local;
  
  this_00 = IRContext::get_def_use_mgr(this->base_->context_);
  __end3 = std::
           unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin(&this->rewritten_);
  insn = (Instruction *)
         std::
         unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
         ::end(&this->rewritten_);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end3.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>,
                       (_Node_iterator_base<spvtools::opt::Instruction_*,_false> *)&insn);
    if (!bVar1) break;
    ppIVar2 = std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator*
                        (&__end3);
    analysis::DefUseManager::AnalyzeInstDef(this_00,*ppIVar2);
    std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator++(&__end3);
  }
  __end3_1 = std::
             unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             ::begin(&this->rewritten_);
  insn_1 = (Instruction *)
           std::
           unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end(&this->rewritten_);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end3_1.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>,
                       (_Node_iterator_base<spvtools::opt::Instruction_*,_false> *)&insn_1);
    if (!bVar1) break;
    ppIVar2 = std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator*
                        (&__end3_1);
    analysis::DefUseManager::AnalyzeInstUse(this_00,*ppIVar2);
    std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator++(&__end3_1);
  }
  return;
}

Assistant:

inline void UpdateManagers() {
      analysis::DefUseManager* def_use_mgr = base_->context_->get_def_use_mgr();
      // Register all new definitions.
      for (Instruction* insn : rewritten_) {
        def_use_mgr->AnalyzeInstDef(insn);
      }
      // Register all new uses.
      for (Instruction* insn : rewritten_) {
        def_use_mgr->AnalyzeInstUse(insn);
      }
    }